

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

int If_CluMinimumBase(word *t,int *pSupp,int nVarsAll,int *pnVars)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  uint iVar;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  word *pwVar10;
  uint uVar11;
  word *pwVar12;
  bool bVar13;
  word local_2038 [1025];
  
  if (0x10 < nVarsAll) {
    __assert_fail("nVarsAll <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x5ff,"int If_CluMinimumBase(word *, int *, int, int *)");
  }
  if (nVarsAll < 1) {
    iVar3 = 0;
    uVar1 = 0;
LAB_00418a76:
    if (pnVars != (int *)0x0) {
      *pnVars = iVar3;
    }
    if ((uVar1 + 1 & uVar1) == 0) {
      iVar3 = 0;
    }
    else {
      if (nVarsAll < 1) {
        bVar13 = true;
        iVar8 = 0;
        pwVar10 = local_2038;
      }
      else {
        pwVar10 = local_2038;
        uVar2 = 0;
        iVar8 = 0;
        uVar11 = 0;
        do {
          if ((uVar1 >> (uVar11 & 0x1f) & 1) != 0) {
            pwVar12 = t;
            iVar = uVar11;
            if (iVar8 < (int)uVar11) {
              do {
                t = pwVar10;
                pwVar10 = pwVar12;
                iVar = iVar - 1;
                If_CluSwapAdjacent(t,pwVar10,iVar,nVarsAll);
                pwVar12 = t;
              } while (iVar8 < (int)iVar);
              uVar2 = (uVar2 - iVar8) + uVar11;
            }
            iVar8 = iVar8 + 1;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != nVarsAll);
        bVar13 = (uVar2 & 1) == 0;
      }
      if (iVar8 != iVar3) {
        __assert_fail("Var == nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                      ,0x5f7,"void If_CluTruthShrink(word *, int, int, unsigned int)");
      }
      if (!bVar13) {
        uVar2 = 1 << ((char)nVarsAll - 6U & 0x1f);
        if (nVarsAll < 7) {
          uVar2 = 1;
        }
        if (0 < (int)uVar2) {
          memcpy(pwVar10,t,(ulong)uVar2 << 3);
        }
      }
      iVar3 = 1;
    }
    return iVar3;
  }
  uVar2 = 1 << ((char)nVarsAll - 6U & 0x1f);
  if (nVarsAll < 7) {
    uVar2 = 1;
  }
  uVar7 = 0;
  uVar1 = 0;
  iVar3 = 0;
LAB_0041898c:
  if (uVar7 < 6) {
    if (0 < (int)uVar2) {
      uVar9 = 0;
      do {
        if ((t[uVar9] & ~Truth6[uVar7]) !=
            (t[uVar9] & Truth6[uVar7]) >> ((byte)(1 << ((byte)uVar7 & 0x1f)) & 0x3f))
        goto LAB_00418a3c;
        uVar9 = uVar9 + 1;
      } while (uVar2 != uVar9);
    }
  }
  else if (0 < (int)uVar2) {
    bVar5 = (byte)(uVar7 - 6);
    uVar11 = 1 << (bVar5 & 0x1f);
    iVar8 = 2 << (bVar5 & 0x1f);
    uVar9 = 1;
    if (1 < (int)uVar11) {
      uVar9 = (ulong)uVar11;
    }
    pwVar10 = t + (int)uVar11;
    iVar6 = 0;
    pwVar12 = t;
    do {
      if (uVar7 - 6 != 0x1f) {
        uVar4 = 0;
        do {
          if (pwVar12[uVar4] != pwVar10[uVar4]) goto LAB_00418a3c;
          uVar4 = uVar4 + 1;
        } while (uVar9 != uVar4);
      }
      iVar6 = iVar6 + iVar8;
      pwVar10 = pwVar10 + iVar8;
      pwVar12 = pwVar12 + iVar8;
    } while (iVar6 < (int)uVar2);
  }
  goto LAB_00418a5a;
LAB_00418a3c:
  if (pSupp != (int *)0x0) {
    pSupp[iVar3] = pSupp[uVar7];
  }
  uVar1 = uVar1 | 1 << ((uint)uVar7 & 0x1f);
  iVar3 = iVar3 + 1;
LAB_00418a5a:
  uVar7 = uVar7 + 1;
  if (uVar7 == (uint)nVarsAll) goto LAB_00418a76;
  goto LAB_0041898c;
}

Assistant:

int If_CluMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars )
{
    int v, iVar = 0, uSupp = 0;
    assert( nVarsAll <= 16 );
    for ( v = 0; v < nVarsAll; v++ )
        if ( If_CluHasVar( t, nVarsAll, v ) )
        {
            uSupp |= (1 << v);
            if ( pSupp )
                pSupp[iVar] = pSupp[v];
            iVar++;
        }
    if ( pnVars )
        *pnVars = iVar;
    if ( If_CluSuppIsMinBase( uSupp ) )
        return 0;
    If_CluTruthShrink( t, iVar, nVarsAll, uSupp );
    return 1;
}